

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSetImplement.h
# Opt level: O0

void * __thiscall
BitSetImplement<std::bitset<128UL>,_KDefectiveBase>::setIntersection
          (BitSetImplement<std::bitset<128UL>,_KDefectiveBase> *this,void *A,void *B)

{
  bitset<128UL> *this_00;
  bitset<128UL> bVar1;
  _WordT local_48;
  _WordT local_40;
  bitset<128UL> *__C__;
  bitset<128UL> *__B__;
  bitset<128UL> *__A__;
  void *B_local;
  void *A_local;
  BitSetImplement<std::bitset<128UL>,_KDefectiveBase> *this_local;
  
  this_00 = (bitset<128UL> *)operator_new(0x10);
  std::bitset<128UL>::bitset(this_00);
  bVar1 = std::operator&((bitset<128UL> *)A,(bitset<128UL> *)B);
  local_48 = bVar1.super__Base_bitset<2UL>._M_w[0];
  (this_00->super__Base_bitset<2UL>)._M_w[0] = local_48;
  local_40 = bVar1.super__Base_bitset<2UL>._M_w[1];
  (this_00->super__Base_bitset<2UL>)._M_w[1] = local_40;
  return this_00;
}

Assistant:

void* BitSetImplement<Bitset, Base>::setIntersection(void *A, void *B) {
	Bitset *__A__ = (Bitset*) A, *__B__ = (Bitset*) B, *__C__ = new Bitset();
	*__C__ = (*__A__) & (*__B__);
	return __C__;
}